

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_avx2.c
# Opt level: O3

void cdef_find_dir_dual_avx2
               (uint16_t *img1,uint16_t *img2,int stride,int32_t *var_out_1st,int32_t *var_out_2nd,
               int coeff_shift,int *out_dir_1st_8x8,int *out_dir_2nd_8x8)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ushort uVar5;
  ushort uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  int32_t cost_second_8x8 [8];
  int32_t cost_first_8x8 [8];
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 local_60 [32];
  
  lVar7 = 0;
  auVar13._8_2_ = 0xff80;
  auVar13._0_8_ = 0xff80ff80ff80ff80;
  auVar13._10_2_ = 0xff80;
  auVar13._12_2_ = 0xff80;
  auVar13._14_2_ = 0xff80;
  auVar13._16_2_ = 0xff80;
  auVar13._18_2_ = 0xff80;
  auVar13._20_2_ = 0xff80;
  auVar13._22_2_ = 0xff80;
  auVar13._24_2_ = 0xff80;
  auVar13._26_2_ = 0xff80;
  auVar13._28_2_ = 0xff80;
  auVar13._30_2_ = 0xff80;
  lVar10 = 0;
  do {
    auVar14._0_16_ =
         ZEXT116(0) * *(undefined1 (*) [16])((long)img2 + lVar10) +
         ZEXT116(1) * *(undefined1 (*) [16])((long)img1 + lVar10);
    auVar14._16_16_ =
         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
         ZEXT116(1) * *(undefined1 (*) [16])((long)img2 + lVar10);
    auVar14 = vpsraw_avx2(auVar14,ZEXT416((uint)coeff_shift));
    auVar14 = vpaddw_avx2(auVar14,auVar13);
    *(undefined1 (*) [32])(local_1c0 + lVar7) = auVar14;
    lVar10 = lVar10 + (long)stride * 2;
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0x100);
  auVar13 = vpslldq_avx2(local_1c0,0xe);
  auVar14 = vpsrldq_avx2(local_1c0,2);
  auVar16 = vpslldq_avx2(local_1a0,0xc);
  auVar13 = vpaddw_avx2(auVar16,auVar13);
  auVar16 = vpsrldq_avx2(local_1a0,4);
  auVar14 = vpaddw_avx2(auVar16,auVar14);
  auVar16 = vpaddw_avx2(local_1a0,local_1c0);
  auVar11 = vpslldq_avx2(local_180,10);
  auVar12 = vpsrldq_avx2(local_180,6);
  auVar19 = vpslldq_avx2(local_160,8);
  auVar11 = vpaddw_avx2(auVar11,auVar19);
  auVar13 = vpaddw_avx2(auVar13,auVar11);
  auVar11 = vpsrldq_avx2(local_160,8);
  auVar11 = vpaddw_avx2(auVar12,auVar11);
  auVar14 = vpaddw_avx2(auVar14,auVar11);
  auVar11 = vpaddw_avx2(local_160,local_180);
  auVar12 = vpslldq_avx2(auVar16,10);
  auVar19 = vpslldq_avx2(auVar11,8);
  auVar12 = vpaddw_avx2(auVar19,auVar12);
  auVar19 = vpslldq_avx2(auVar16,4);
  auVar15 = vpslldq_avx2(auVar11,6);
  auVar19 = vpaddw_avx2(auVar15,auVar19);
  auVar15 = vpaddw_avx2(auVar11,auVar16);
  auVar20 = vpslldq_avx2(local_140,6);
  auVar21 = vpsrldq_avx2(local_140,10);
  auVar25 = vpslldq_avx2(local_120,4);
  auVar20 = vpaddw_avx2(auVar25,auVar20);
  auVar25 = vpsrldq_avx2(local_120,0xc);
  auVar21 = vpaddw_avx2(auVar21,auVar25);
  auVar25 = vpaddw_avx2(local_120,local_140);
  auVar17 = vpslldq_avx2(auVar25,6);
  auVar23 = vpslldq_avx2(auVar25,8);
  auVar27 = vpslldq_avx2(local_100,2);
  auVar26 = vpsrldq_avx2(local_100,0xe);
  auVar21 = vpaddw_avx2(auVar21,auVar26);
  auVar14 = vpaddw_avx2(auVar21,auVar14);
  auVar20 = vpaddw_avx2(local_e0,auVar20);
  auVar13 = vpaddw_avx2(auVar13,auVar20);
  auVar13 = vpaddw_avx2(auVar27,auVar13);
  auVar20 = vpaddw_avx2(local_e0,local_100);
  auVar21 = vpslldq_avx2(auVar20,4);
  auVar21 = vpaddw_avx2(auVar21,auVar17);
  auVar12 = vpaddw_avx2(auVar12,auVar21);
  auVar21 = vpslldq_avx2(auVar20,10);
  auVar21 = vpaddw_avx2(auVar23,auVar21);
  auVar19 = vpaddw_avx2(auVar19,auVar21);
  auVar21 = vpaddw_avx2(auVar25,auVar20);
  auVar15 = vpaddw_avx2(auVar15,auVar21);
  auVar14 = vpshufb_avx2(auVar14,_DAT_0056eea0);
  auVar21 = vpunpcklwd_avx2(auVar13,auVar14);
  auVar14 = vpunpckhwd_avx2(auVar13,auVar14);
  auVar13 = vpmaddwd_avx2(auVar21,auVar21);
  auVar14 = vpmaddwd_avx2(auVar14,auVar14);
  local_60._16_16_ = _DAT_0056d5f0;
  local_60._0_16_ = _DAT_0056d5f0;
  auVar13 = vpmulld_avx2(auVar13,local_60);
  local_80._16_16_ = _DAT_0056d600;
  local_80._0_16_ = _DAT_0056d600;
  auVar14 = vpmulld_avx2(auVar14,local_80);
  auVar21 = vpaddd_avx2(auVar14,auVar13);
  auVar28._16_16_ = _DAT_0056ee60;
  auVar28._0_16_ = _DAT_0056ee60;
  auVar13 = vpshufb_avx2(auVar16,auVar28);
  auVar24._16_16_ = _DAT_0056ee70;
  auVar24._0_16_ = _DAT_0056ee70;
  auVar14 = vpshufb_avx2(auVar11,auVar24);
  auVar13 = vpaddw_avx2(auVar14,auVar13);
  auVar22._16_16_ = _DAT_0056d610;
  auVar22._0_16_ = _DAT_0056d610;
  auVar14 = vpshufb_avx2(auVar25,auVar22);
  auVar23._16_16_ = _DAT_0056d620;
  auVar23._0_16_ = _DAT_0056d620;
  auVar17 = vpshufb_avx2(auVar20,auVar23);
  auVar14 = vpaddw_avx2(auVar14,auVar17);
  auVar13 = vpaddw_avx2(auVar13,auVar14);
  auVar17 = vpunpcklwd_avx2(auVar19,auVar13);
  auVar14 = vpunpckhwd_avx2(auVar19,auVar13);
  auVar13 = vpmaddwd_avx2(auVar17,auVar17);
  auVar26._16_16_ = _DAT_0056d630;
  auVar26._0_16_ = _DAT_0056d630;
  auVar14 = vpmaddwd_avx2(auVar14,auVar14);
  auVar13 = vpmulld_avx2(auVar13,auVar26);
  local_c0._16_16_ = _DAT_0056d640;
  local_c0._0_16_ = _DAT_0056d640;
  auVar14 = vpmulld_avx2(auVar14,local_c0);
  auVar19 = vpaddd_avx2(auVar14,auVar13);
  auVar13 = vpshufb_avx2(auVar16,auVar23);
  auVar14 = vpshufb_avx2(auVar11,auVar22);
  auVar13 = vpaddw_avx2(auVar14,auVar13);
  auVar14 = vpshufb_avx2(auVar25,auVar24);
  auVar16 = vpshufb_avx2(auVar20,auVar28);
  auVar14 = vpaddw_avx2(auVar14,auVar16);
  auVar13 = vpaddw_avx2(auVar13,auVar14);
  auVar16 = vpunpcklwd_avx2(auVar12,auVar13);
  auVar14 = vpunpckhwd_avx2(auVar12,auVar13);
  auVar13 = vpmaddwd_avx2(auVar16,auVar16);
  auVar14 = vpmaddwd_avx2(auVar14,auVar14);
  auVar13 = vpmulld_avx2(auVar13,auVar26);
  auVar14 = vpmulld_avx2(auVar14,local_c0);
  auVar13 = vpaddd_avx2(auVar14,auVar13);
  auVar11 = vpunpckldq_avx2(auVar21,auVar13);
  auVar14 = vpunpckhdq_avx2(auVar21,auVar13);
  local_a0._8_4_ = 0x69;
  local_a0._0_8_ = 0x6900000069;
  local_a0._12_4_ = 0x69;
  local_a0._16_4_ = 0x69;
  local_a0._20_4_ = 0x69;
  local_a0._24_4_ = 0x69;
  local_a0._28_4_ = 0x69;
  auVar13 = vpmaddwd_avx2(auVar15,auVar15);
  auVar13 = vpmulld_avx2(auVar13,local_a0);
  auVar12 = vpunpckldq_avx2(auVar13,auVar19);
  auVar16 = vpunpckhdq_avx2(auVar13,auVar19);
  auVar19 = vpunpcklqdq_avx2(auVar11,auVar12);
  auVar13 = vpunpckhqdq_avx2(auVar11,auVar12);
  auVar11 = vpunpcklqdq_avx2(auVar14,auVar16);
  auVar13 = vpaddd_avx2(auVar13,auVar11);
  auVar14 = vpunpckhqdq_avx2(auVar14,auVar16);
  auVar14 = vpaddd_avx2(auVar19,auVar14);
  auVar17 = vpaddd_avx2(auVar14,auVar13);
  auVar12 = vpunpcklwd_avx2(local_1c0,local_1a0);
  auVar13 = vpunpckhwd_avx2(local_1c0,local_1a0);
  auVar19 = vpunpcklwd_avx2(local_180,local_160);
  auVar14 = vpunpckhwd_avx2(local_180,local_160);
  auVar20 = vpunpcklwd_avx2(local_140,local_120);
  auVar16 = vpunpckhwd_avx2(local_140,local_120);
  auVar21 = vpunpcklwd_avx2(local_100,local_e0);
  auVar11 = vpunpckhwd_avx2(local_100,local_e0);
  auVar25 = vpunpckldq_avx2(auVar12,auVar19);
  auVar15 = vpunpckhdq_avx2(auVar12,auVar19);
  auVar12 = vpunpckldq_avx2(auVar20,auVar21);
  auVar20 = vpunpckhdq_avx2(auVar20,auVar21);
  auVar19 = vpunpckldq_avx2(auVar13,auVar14);
  auVar13 = vpunpckhdq_avx2(auVar13,auVar14);
  auVar21 = vpunpckldq_avx2(auVar16,auVar11);
  auVar14 = vpunpckhdq_avx2(auVar16,auVar11);
  local_e0 = vpunpcklqdq_avx2(auVar25,auVar12);
  local_100 = vpunpckhqdq_avx2(auVar25,auVar12);
  auVar11 = vpunpcklqdq_avx2(auVar13,auVar14);
  auVar16 = vpunpckhqdq_avx2(auVar13,auVar14);
  auVar13 = vpslldq_avx2(auVar13,0xc);
  auVar14 = vpslldq_avx2(auVar16,0xe);
  auVar13 = vpaddw_avx2(auVar14,auVar13);
  auVar14 = vpsrldq_avx2(auVar16,2);
  auVar12 = vpsrldq_avx2(auVar11,4);
  auVar14 = vpaddw_avx2(auVar12,auVar14);
  auVar16 = vpaddw_avx2(auVar11,auVar16);
  auVar25 = vpunpcklqdq_avx2(auVar19,auVar21);
  auVar12 = vpunpckhqdq_avx2(auVar19,auVar21);
  auVar11 = vpslldq_avx2(auVar19,8);
  auVar19 = vpslldq_avx2(auVar12,10);
  auVar11 = vpaddw_avx2(auVar19,auVar11);
  auVar13 = vpaddw_avx2(auVar11,auVar13);
  auVar11 = vpsrldq_avx2(auVar12,6);
  auVar19 = vpsrldq_avx2(auVar25,8);
  auVar11 = vpaddw_avx2(auVar11,auVar19);
  auVar14 = vpaddw_avx2(auVar14,auVar11);
  auVar11 = vpaddw_avx2(auVar25,auVar12);
  auVar12 = vpslldq_avx2(auVar16,10);
  auVar19 = vpslldq_avx2(auVar11,8);
  auVar12 = vpaddw_avx2(auVar19,auVar12);
  auVar19 = vpslldq_avx2(auVar16,4);
  auVar21 = vpslldq_avx2(auVar11,6);
  auVar19 = vpaddw_avx2(auVar21,auVar19);
  auVar25 = vpunpcklqdq_avx2(auVar15,auVar20);
  auVar21 = vpunpckhqdq_avx2(auVar15,auVar20);
  auVar15 = vpslldq_avx2(auVar21,6);
  auVar23 = vpslldq_avx2(auVar25,4);
  auVar15 = vpaddw_avx2(auVar23,auVar15);
  auVar20 = vpsrldq_avx2(auVar20,10);
  auVar23 = vpsrldq_avx2(auVar25,0xc);
  auVar20 = vpaddw_avx2(auVar20,auVar23);
  auVar21 = vpaddw_avx2(auVar25,auVar21);
  auVar25 = vpsrldq_avx2(local_100,0xe);
  auVar20 = vpaddw_avx2(auVar20,auVar25);
  auVar14 = vpaddw_avx2(auVar14,auVar20);
  auVar15 = vpaddw_avx2(local_e0,auVar15);
  auVar13 = vpaddw_avx2(auVar13,auVar15);
  auVar15 = vpslldq_avx2(local_100,2);
  auVar13 = vpaddw_avx2(auVar13,auVar15);
  auVar15 = vpaddw_avx2(local_e0,local_100);
  auVar20 = vpslldq_avx2(auVar21,6);
  auVar25 = vpslldq_avx2(auVar15,4);
  auVar20 = vpaddw_avx2(auVar25,auVar20);
  auVar12 = vpaddw_avx2(auVar12,auVar20);
  auVar20 = vpslldq_avx2(auVar21,8);
  auVar25 = vpslldq_avx2(auVar15,10);
  auVar20 = vpaddw_avx2(auVar25,auVar20);
  auVar19 = vpaddw_avx2(auVar19,auVar20);
  auVar20 = vpaddw_avx2(auVar11,auVar16);
  auVar25 = vpaddw_avx2(auVar21,auVar15);
  auVar20 = vpaddw_avx2(auVar25,auVar20);
  auVar14 = vpshufb_avx2(auVar14,_DAT_0056eea0);
  auVar23 = vpunpcklwd_avx2(auVar13,auVar14);
  auVar25 = vpunpckhwd_avx2(auVar13,auVar14);
  auVar13 = vpmaddwd_avx2(auVar23,auVar23);
  auVar14 = vpmulld_avx2(auVar13,local_60);
  auVar13 = vpmaddwd_avx2(auVar25,auVar25);
  auVar13 = vpmulld_avx2(auVar13,local_80);
  auVar25 = vpaddd_avx2(auVar13,auVar14);
  auVar13 = vpshufb_avx2(auVar16,auVar28);
  auVar14 = vpshufb_avx2(auVar11,auVar24);
  auVar13 = vpaddw_avx2(auVar14,auVar13);
  auVar18._16_16_ = _DAT_0056d610;
  auVar18._0_16_ = _DAT_0056d610;
  auVar14 = vpshufb_avx2(auVar21,auVar18);
  auVar27._16_16_ = _DAT_0056d620;
  auVar27._0_16_ = _DAT_0056d620;
  auVar23 = vpshufb_avx2(auVar15,auVar27);
  auVar14 = vpaddw_avx2(auVar23,auVar14);
  auVar13 = vpaddw_avx2(auVar13,auVar14);
  auVar23 = vpunpcklwd_avx2(auVar19,auVar13);
  auVar14 = vpunpckhwd_avx2(auVar19,auVar13);
  auVar13 = vpmaddwd_avx2(auVar23,auVar23);
  auVar14 = vpmaddwd_avx2(auVar14,auVar14);
  auVar13 = vpmulld_avx2(auVar13,auVar26);
  auVar14 = vpmulld_avx2(auVar14,local_c0);
  auVar19 = vpaddd_avx2(auVar14,auVar13);
  auVar13 = vpshufb_avx2(auVar16,auVar27);
  auVar14 = vpshufb_avx2(auVar11,auVar18);
  auVar13 = vpaddw_avx2(auVar14,auVar13);
  auVar14 = vpshufb_avx2(auVar21,auVar24);
  auVar16 = vpshufb_avx2(auVar15,auVar28);
  auVar14 = vpaddw_avx2(auVar14,auVar16);
  auVar13 = vpaddw_avx2(auVar13,auVar14);
  auVar14 = vpunpcklwd_avx2(auVar12,auVar13);
  auVar16 = vpunpckhwd_avx2(auVar12,auVar13);
  auVar13 = vpmaddwd_avx2(auVar14,auVar14);
  auVar14 = vpmulld_avx2(auVar13,auVar26);
  auVar13 = vpmaddwd_avx2(auVar16,auVar16);
  auVar13 = vpmulld_avx2(auVar13,local_c0);
  auVar13 = vpaddd_avx2(auVar13,auVar14);
  auVar14 = vpmaddwd_avx2(auVar20,auVar20);
  auVar14 = vpmulld_avx2(auVar14,local_a0);
  auVar11 = vpunpckldq_avx2(auVar25,auVar13);
  auVar16 = vpunpckhdq_avx2(auVar25,auVar13);
  auVar13 = vpunpckldq_avx2(auVar14,auVar19);
  auVar14 = vpunpckhdq_avx2(auVar14,auVar19);
  auVar12 = vpunpcklqdq_avx2(auVar11,auVar13);
  auVar13 = vpunpckhqdq_avx2(auVar11,auVar13);
  auVar11 = vpunpcklqdq_avx2(auVar16,auVar14);
  auVar13 = vpaddd_avx2(auVar13,auVar11);
  local_1d0 = auVar17._0_16_;
  auVar14 = vpunpckhqdq_avx2(auVar16,auVar14);
  local_1f0 = auVar17._16_16_;
  auVar14 = vpaddd_avx2(auVar12,auVar14);
  auVar13 = vpaddd_avx2(auVar14,auVar13);
  local_1e0 = auVar13._0_16_;
  auVar14 = vpmaxsd_avx2(auVar13,auVar17);
  auVar16 = vpshufd_avx2(auVar14,0x4e);
  auVar14 = vpmaxsd_avx2(auVar14,auVar16);
  auVar16 = vpshufd_avx2(auVar14,0x39);
  auVar14 = vpmaxsd_avx2(auVar14,auVar16);
  local_200 = auVar13._16_16_;
  auVar2 = vpcmpeqd_avx(auVar14._0_16_,auVar17._0_16_);
  auVar3 = vpcmpeqd_avx(auVar14._0_16_,auVar13._0_16_);
  auVar2 = vpackssdw_avx(auVar3,auVar2);
  auVar3 = vpcmpeqd_avx(auVar14._16_16_,auVar17._16_16_);
  auVar4 = vpcmpeqd_avx(auVar14._16_16_,auVar13._16_16_);
  auVar3 = vpackssdw_avx(auVar4,auVar3);
  auVar2 = vpacksswb_avx(auVar2,auVar2);
  uVar5 = (ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
          (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 | (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3
          | (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
          (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 | (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6
          | (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
          (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 | (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9
          | (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
          (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
          (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
          (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
          (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe | (ushort)(byte)(auVar2[0xf] >> 7) << 0xf;
  auVar2 = vpacksswb_avx(auVar3,auVar3);
  uVar6 = (ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
          (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 | (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3
          | (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
          (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 | (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6
          | (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
          (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 | (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9
          | (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
          (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
          (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
          (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
          (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe | (ushort)(byte)(auVar2[0xf] >> 7) << 0xf;
  uVar8 = uVar5 - 1 ^ (uint)uVar5;
  uVar1 = 0x1f;
  if (uVar8 != 0) {
    for (; uVar8 >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  uVar9 = uVar6 - 1 ^ (uint)uVar6;
  uVar8 = 0x1f;
  if (uVar9 != 0) {
    for (; uVar9 >> uVar8 == 0; uVar8 = uVar8 - 1) {
    }
  }
  *var_out_1st = auVar14._0_4_ - *(int *)(local_1e0 + (ulong)(uVar1 & 7 ^ 4) * 4);
  *var_out_2nd = auVar14._16_4_ - *(int *)(local_200 + (ulong)(uVar8 & 7 ^ 4) * 4);
  *var_out_1st = *var_out_1st >> 10;
  *var_out_2nd = *var_out_2nd >> 10;
  *out_dir_1st_8x8 = uVar1;
  *out_dir_2nd_8x8 = uVar8;
  return;
}

Assistant:

void cdef_find_dir_dual_avx2(const uint16_t *img1, const uint16_t *img2,
                             int stride, int32_t *var_out_1st,
                             int32_t *var_out_2nd, int coeff_shift,
                             int *out_dir_1st_8x8, int *out_dir_2nd_8x8) {
  int32_t cost_first_8x8[8];
  int32_t cost_second_8x8[8];
  // Used to store the best cost for 2 8x8's.
  int32_t best_cost[2] = { 0 };
  // Best direction for 2 8x8's.
  int best_dir[2] = { 0 };

  const __m128i const_coeff_shift_reg = _mm_cvtsi32_si128(coeff_shift);
  const __m256i const_128_reg = _mm256_set1_epi16(128);
  __m256i lines[8];
  for (int i = 0; i < 8; i++) {
    const __m128i src_1 = _mm_loadu_si128((const __m128i *)&img1[i * stride]);
    const __m128i src_2 = _mm_loadu_si128((const __m128i *)&img2[i * stride]);

    lines[i] = _mm256_insertf128_si256(_mm256_castsi128_si256(src_1), src_2, 1);
    lines[i] = _mm256_sub_epi16(
        _mm256_sra_epi16(lines[i], const_coeff_shift_reg), const_128_reg);
  }

  /* Compute "mostly vertical" directions. */
  const __m256i dir47 =
      compute_directions_avx2(lines, cost_first_8x8 + 4, cost_second_8x8 + 4);

  /* Transpose and reverse the order of the lines. */
  array_reverse_transpose_8x8_avx2(lines, lines);

  /* Compute "mostly horizontal" directions. */
  const __m256i dir03 =
      compute_directions_avx2(lines, cost_first_8x8, cost_second_8x8);

  __m256i max = _mm256_max_epi32(dir03, dir47);
  max =
      _mm256_max_epi32(max, _mm256_or_si256(_mm256_srli_si256(max, 8),
                                            _mm256_slli_si256(max, 16 - (8))));
  max =
      _mm256_max_epi32(max, _mm256_or_si256(_mm256_srli_si256(max, 4),
                                            _mm256_slli_si256(max, 16 - (4))));

  const __m128i first_8x8_output = _mm256_castsi256_si128(max);
  const __m128i second_8x8_output = _mm256_extractf128_si256(max, 1);
  const __m128i cmpeg_res_00 =
      _mm_cmpeq_epi32(first_8x8_output, _mm256_castsi256_si128(dir47));
  const __m128i cmpeg_res_01 =
      _mm_cmpeq_epi32(first_8x8_output, _mm256_castsi256_si128(dir03));
  const __m128i cmpeg_res_10 =
      _mm_cmpeq_epi32(second_8x8_output, _mm256_extractf128_si256(dir47, 1));
  const __m128i cmpeg_res_11 =
      _mm_cmpeq_epi32(second_8x8_output, _mm256_extractf128_si256(dir03, 1));
  const __m128i t_first_8x8 = _mm_packs_epi32(cmpeg_res_01, cmpeg_res_00);
  const __m128i t_second_8x8 = _mm_packs_epi32(cmpeg_res_11, cmpeg_res_10);

  best_cost[0] = _mm_cvtsi128_si32(_mm256_castsi256_si128(max));
  best_cost[1] = _mm_cvtsi128_si32(second_8x8_output);
  best_dir[0] = _mm_movemask_epi8(_mm_packs_epi16(t_first_8x8, t_first_8x8));
  best_dir[0] =
      get_msb(best_dir[0] ^ (best_dir[0] - 1));  // Count trailing zeros
  best_dir[1] = _mm_movemask_epi8(_mm_packs_epi16(t_second_8x8, t_second_8x8));
  best_dir[1] =
      get_msb(best_dir[1] ^ (best_dir[1] - 1));  // Count trailing zeros

  /* Difference between the optimal variance and the variance along the
     orthogonal direction. Again, the sum(x^2) terms cancel out. */
  *var_out_1st = best_cost[0] - cost_first_8x8[(best_dir[0] + 4) & 7];
  *var_out_2nd = best_cost[1] - cost_second_8x8[(best_dir[1] + 4) & 7];

  /* We'd normally divide by 840, but dividing by 1024 is close enough
  for what we're going to do with this. */
  *var_out_1st >>= 10;
  *var_out_2nd >>= 10;
  *out_dir_1st_8x8 = best_dir[0];
  *out_dir_2nd_8x8 = best_dir[1];
}